

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeBase * __thiscall
anon_unknown.dwarf_1117a3::LookupTypeByName
          (anon_unknown_dwarf_1117a3 *this,ExpressionContext *ctx,uint nameHash)

{
  TypeBase *pTVar1;
  uint *puVar2;
  long lVar3;
  uint *puVar4;
  ScopeData *scope;
  
  do {
    if (this == (anon_unknown_dwarf_1117a3 *)0x0) {
      return (TypeBase *)0x0;
    }
    lVar3 = (ulong)(*(int *)(this + 0x138) - 1U & nameHash) * 0x20;
    if (*(long *)(*(long *)(this + 0x140) + 0x18 + lVar3) != 0) {
      puVar2 = (uint *)(*(long *)(this + 0x140) + lVar3);
      puVar4 = puVar2;
      while (puVar4 != (uint *)0x0) {
        if (*puVar4 == nameHash) {
          pTVar1 = *(TypeBase **)(puVar4 + 2);
          if (pTVar1 == (TypeBase *)0x0) {
            if ((((ctx == (ExpressionContext *)0x0) ||
                 (this[0x150] != (anon_unknown_dwarf_1117a3)0x0)) ||
                ((*(long **)(puVar4 + 4))[1] != 0)) ||
               (*(ModuleData ***)(**(long **)(puVar4 + 4) + 0x20) <= (ctx->uniqueDependencies).data)
               ) {
              return *(TypeBase **)(*(long *)(puVar4 + 4) + 0x18);
            }
          }
          else {
            if (ctx == (ExpressionContext *)0x0) {
              return pTVar1;
            }
            if (this[0x150] != (anon_unknown_dwarf_1117a3)0x0) {
              return pTVar1;
            }
            if (pTVar1->importModule != (ModuleData *)0x0) {
              return pTVar1;
            }
            lVar3 = 0xd8;
            if (pTVar1->typeID != 0x18) {
              if (pTVar1->typeID != 0x16) {
                return pTVar1;
              }
              lVar3 = 0xc0;
            }
            lVar3 = *(long *)((long)&pTVar1->_vptr_TypeBase + lVar3);
            if (lVar3 == 0) {
              return pTVar1;
            }
            if (*(ModuleData ***)(lVar3 + 0x20) <= (ctx->uniqueDependencies).data) {
              return pTVar1;
            }
          }
          break;
        }
        puVar4 = *(uint **)(puVar4 + 6);
        if (puVar4 == puVar2) break;
      }
    }
    this = *(anon_unknown_dwarf_1117a3 **)this;
  } while( true );
}

Assistant:

TypeBase* LookupTypeByName(ExpressionContext &ctx, unsigned nameHash)
	{
		ScopeData *scope = ctx.scope;

		while(scope)
		{
			if(TypeLookupResult *lookup = scope->typeLookupMap.find(nameHash))
			{
				if(TypeBase *type = lookup->type)
				{
					// Check type visibility
					if(ctx.lookupLocation && !scope->unrestricted && !type->importModule)
					{
						SynBase *typeLocation = NULL;

						if(TypeClass *exact = getType<TypeClass>(type))
							typeLocation = exact->source;
						else if(TypeGenericClassProto *exact = getType<TypeGenericClassProto>(type))
							typeLocation = exact->definition;

						if(typeLocation && typeLocation->pos.begin > ctx.lookupLocation->pos.begin)
						{
							scope = scope->scope;
							continue;
						}
					}

					return lookup->type;
				}

				// Check alias visibility
				if(ctx.lookupLocation && !scope->unrestricted && !lookup->alias->importModule)
				{
					if(lookup->alias->source->pos.begin > ctx.lookupLocation->pos.begin)
					{
						scope = scope->scope;
						continue;
					}
				}

				return lookup->alias->type;
			}

			scope = scope->scope;
		}

		return NULL;
	}